

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EOS.cpp
# Opt level: O0

void pele::physics::eos::atomic_weightsCHON<pele::physics::eos::Fuego>(Real *atwCHON)

{
  undefined8 *in_RDI;
  int i_1;
  int i;
  Real atw [3];
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ename;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  int local_50;
  int local_4c;
  undefined8 local_48 [8];
  undefined8 *local_8;
  
  local_8 = in_RDI;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x123548);
  CKSYME_STR((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x123552);
  CKAWT((Real *)0x12355e);
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    local_8[local_4c] = 0;
  }
  for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0)))),
                 (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))),
                         in_stack_ffffffffffffff98);
    if ((bool)in_stack_ffffffffffffffa7) {
      *local_8 = local_48[local_50];
    }
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0)))),
                 (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa6 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))),
                         in_stack_ffffffffffffff98);
    if ((bool)in_stack_ffffffffffffffa6) {
      local_8[1] = local_48[local_50];
    }
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0)))),
                 (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa5 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))),
                         in_stack_ffffffffffffff98);
    if ((bool)in_stack_ffffffffffffffa5) {
      local_8[2] = local_48[local_50];
    }
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0)))),
                 (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa4 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))),
                         in_stack_ffffffffffffff98);
    if ((bool)in_stack_ffffffffffffffa4) {
      local_8[3] = local_48[local_50];
    }
  }
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1236e5);
  return;
}

Assistant:

void
atomic_weightsCHON<Fuego>(amrex::Real atwCHON[])
{
  amrex::Vector<std::string> ename;
  CKSYME_STR(ename);
  amrex::Real atw[NUM_ELEMENTS];
  CKAWT(atw);
  // CHON
  for (int i = 0; i < 4; i++) {
    atwCHON[i] = 0.0;
  }
  for (int i = 0; i < NUM_ELEMENTS; i++) {
    if (ename[i] == "C") {
      atwCHON[0] = atw[i];
    }
    if (ename[i] == "H") {
      atwCHON[1] = atw[i];
    }
    if (ename[i] == "O") {
      atwCHON[2] = atw[i];
    }
    if (ename[i] == "N") {
      atwCHON[3] = atw[i];
    }
  }
}